

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  undefined1 local_220 [8];
  string field;
  string basename;
  string directory;
  undefined1 local_1b8 [8];
  string savepointId;
  undefined1 local_190 [8];
  string filepath;
  Bounds local_150;
  Bounds lBounds;
  Bounds local_128;
  Bounds kBounds;
  Bounds local_100;
  Bounds jBounds;
  Bounds local_d8;
  Bounds iBounds;
  string local_c8 [6];
  bool infoOnly;
  string l;
  string local_a0 [8];
  string k;
  string local_78 [8];
  string j;
  allocator local_41;
  string local_40 [8];
  string i;
  int opt;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printHelp();
    argv_local._4_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,":",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,":",(allocator *)(k.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(k.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,":",(allocator *)(l.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(l.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,":",(allocator *)((long)&iBounds.upper + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&iBounds.upper + 3));
    iBounds.upper._2_1_ = 0;
    while (i.field_2._12_4_ = getopt(argc,argv,"i:j:k:l:q:h"), i.field_2._12_4_ != -1) {
      switch(i.field_2._12_4_) {
      case 0x68:
        printHelp();
        argv_local._4_4_ = 0;
        iBounds.lower = 1;
        goto LAB_00133852;
      case 0x69:
        std::__cxx11::string::operator=(local_40,_optarg);
        break;
      case 0x6a:
        std::__cxx11::string::operator=(local_78,_optarg);
        break;
      case 0x6b:
        std::__cxx11::string::operator=(local_a0,_optarg);
        break;
      case 0x6c:
        std::__cxx11::string::operator=(local_c8,_optarg);
        break;
      case 0x71:
        iBounds.upper._2_1_ = 1;
      }
    }
    std::__cxx11::string::string((string *)&jBounds,local_40);
    local_d8 = string2bounds((string *)&jBounds);
    std::__cxx11::string::~string((string *)&jBounds);
    std::__cxx11::string::string((string *)&kBounds,local_78);
    local_100 = string2bounds((string *)&kBounds);
    std::__cxx11::string::~string((string *)&kBounds);
    std::__cxx11::string::string((string *)&lBounds,local_a0);
    local_128 = string2bounds((string *)&lBounds);
    std::__cxx11::string::~string((string *)&lBounds);
    std::__cxx11::string::string((string *)(filepath.field_2._M_local_buf + 8),local_c8);
    local_150 = string2bounds((string *)((long)&filepath.field_2 + 8));
    std::__cxx11::string::~string((string *)(filepath.field_2._M_local_buf + 8));
    lVar4 = (long)_optind;
    _optind = _optind + 1;
    pcVar1 = argv[lVar4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_190,pcVar1,(allocator *)(savepointId.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(savepointId.field_2._M_local_buf + 0xf));
    lVar4 = (long)_optind;
    _optind = _optind + 1;
    pcVar1 = argv[lVar4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1b8,pcVar1,(allocator *)(directory.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(directory.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)(basename.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(field.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_220);
    bVar2 = splitFilePath((string *)local_190,(string *)(basename.field_2._M_local_buf + 8),
                          (string *)(field.field_2._M_local_buf + 8),(string *)local_220);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Directory: ");
      poVar3 = std::operator<<(poVar3,(string *)(basename.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Basename: ");
      poVar3 = std::operator<<(poVar3,(string *)(field.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"SavepointId: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1b8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ =
           dump((string *)((long)&basename.field_2 + 8),(string *)((long)&field.field_2 + 8),
                (string *)local_220,(string *)local_1b8,&local_d8,&local_100,&local_128,&local_150,
                (bool)(iBounds.upper._2_1_ & 1));
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid file: ");
      poVar3 = std::operator<<(poVar3,(string *)local_190);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 2;
    }
    iBounds.lower = 1;
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)(field.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(basename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_190);
LAB_00133852:
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char **argv) {

	if (argc < 2)
	{
		printHelp();
		return 0;
	}

	int opt;
	std::string i = ":";
	std::string j = ":";
	std::string k = ":";
	std::string l = ":";
	bool infoOnly = false;
	while ( (opt = getopt(argc, argv, "i:j:k:l:q:h")) != -1) {
		switch (opt)
		{
		case 'i':
			i = optarg;
			break;
		case 'j':
			j = optarg;
			break;
		case 'k':
			k = optarg;
			break;
		case 'l':
			l = optarg;
			break;
		case 'q':
			infoOnly = true;
			break;
		case 'h':
			printHelp();
			return 0;
		}
	}

	Bounds iBounds = string2bounds(i);
	Bounds jBounds = string2bounds(j);
	Bounds kBounds = string2bounds(k);
	Bounds lBounds = string2bounds(l);

	std::string filepath = argv[optind++];
	std::string savepointId = argv[optind++];

	std::string directory;
	std::string basename;
	std::string field;
	if (!splitFilePath(filepath, directory, basename, field))
	{
		std::cerr << "Invalid file: " << filepath << std::endl;
		return 2;
	}

	std::cout << "Directory: " << directory << std::endl;
	std::cout << "Basename: " << basename << std::endl;
	std::cout << "SavepointId: " << savepointId << std::endl;

	return dump(directory, basename, field, savepointId,
	            iBounds, jBounds, kBounds, lBounds, infoOnly);
}